

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbeddedClasses.cpp
# Opt level: O1

void chatra::Dict::native_keys
               (NativeCallHandler handler,Thread *thread,ObjectBase *object,StringId name,
               StringId subName,Tuple *args,Reference ret)

{
  char cVar1;
  String *this;
  long lVar2;
  __uniq_ptr_impl<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_> _Var3;
  string local_68;
  Reference local_48;
  Reference ret_local;
  Reference local_38;
  
  local_48.node = ret.node;
  do {
    LOCK();
    cVar1 = *(char *)&object[1].super_Object._vptr_Object;
    *(undefined1 *)&object[1].super_Object._vptr_Object = 1;
    UNLOCK();
  } while (cVar1 != '\0');
  local_38.node =
       (ReferenceNode *)
       object[1].super_Object.groups.
       super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ret_local.node =
       (ReferenceNode *)
       Reference::allocateWithoutLock<chatra::Array,unsigned_long>
                 (&local_48,(unsigned_long *)&local_38);
  _Var3._M_t.
  super__Tuple_impl<0UL,_chatra::ReferenceGroup_*,_std::default_delete<chatra::ReferenceGroup>_>.
  super__Head_base<0UL,_chatra::ReferenceGroup_*,_false>._M_head_impl =
       (tuple<chatra::ReferenceGroup_*,_std::default_delete<chatra::ReferenceGroup>_>)
       object[1].super_Object.groups.
       super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (_Var3._M_t.
      super__Tuple_impl<0UL,_chatra::ReferenceGroup_*,_std::default_delete<chatra::ReferenceGroup>_>
      .super__Head_base<0UL,_chatra::ReferenceGroup_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_chatra::ReferenceGroup_*,_std::default_delete<chatra::ReferenceGroup>_>)0x0)
  {
    lVar2 = 0;
    do {
      local_38.node =
           *(ReferenceNode **)
            (*(long *)((ret_local.node[4].object)->_vptr_Object[2] + 0x90) + lVar2);
      this = Reference::allocateWithoutLock<chatra::String>(&local_38);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,
                 *(long *)((long)_Var3._M_t.
                                 super__Tuple_impl<0UL,_chatra::ReferenceGroup_*,_std::default_delete<chatra::ReferenceGroup>_>
                                 .super__Head_base<0UL,_chatra::ReferenceGroup_*,_false>.
                                 _M_head_impl + 8),
                 *(long *)((long)_Var3._M_t.
                                 super__Tuple_impl<0UL,_chatra::ReferenceGroup_*,_std::default_delete<chatra::ReferenceGroup>_>
                                 .super__Head_base<0UL,_chatra::ReferenceGroup_*,_false>.
                                 _M_head_impl + 0x10) +
                 *(long *)((long)_Var3._M_t.
                                 super__Tuple_impl<0UL,_chatra::ReferenceGroup_*,_std::default_delete<chatra::ReferenceGroup>_>
                                 .super__Head_base<0UL,_chatra::ReferenceGroup_*,_false>.
                                 _M_head_impl + 8));
      String::setValue(this,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      _Var3._M_t.
      super__Tuple_impl<0UL,_chatra::ReferenceGroup_*,_std::default_delete<chatra::ReferenceGroup>_>
      .super__Head_base<0UL,_chatra::ReferenceGroup_*,_false>._M_head_impl =
           *(tuple<chatra::ReferenceGroup_*,_std::default_delete<chatra::ReferenceGroup>_> *)
            _Var3._M_t.
            super__Tuple_impl<0UL,_chatra::ReferenceGroup_*,_std::default_delete<chatra::ReferenceGroup>_>
            .super__Head_base<0UL,_chatra::ReferenceGroup_*,_false>._M_head_impl;
      lVar2 = lVar2 + 8;
    } while ((__uniq_ptr_impl<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>)
             _Var3._M_t.
             super__Tuple_impl<0UL,_chatra::ReferenceGroup_*,_std::default_delete<chatra::ReferenceGroup>_>
             .super__Head_base<0UL,_chatra::ReferenceGroup_*,_false>._M_head_impl !=
             (__uniq_ptr_impl<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>)
             0x0);
  }
  *(undefined1 *)&object[1].super_Object._vptr_Object = 0;
  return;
}

Assistant:

void Dict::native_keys(CHATRA_NATIVE_ARGS) {
	CHATRA_NATIVE_SELF;
	std::lock_guard<SpinLock> lock(self.lockValue);

	auto& retValue = ret.allocate<Array>(self.keyToIndex.size());
	size_t index = 0;
	for (auto& e : self.keyToIndex)
		retValue.container().ref(index++).allocate<String>().setValue(e.first);
}